

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildKey-C-API.cpp
# Opt level: O0

llb_build_key_kind_t anon_unknown.dwarf_1e10c2::internalToPublicBuildKeyKind(Kind kind)

{
  code *pcVar1;
  llb_build_key_kind_t local_c;
  Kind kind_local;
  
  switch(kind) {
  case Command:
    local_c = llb_build_key_kind_command;
    break;
  case CustomTask:
    local_c = llb_build_key_kind_custom_task;
    break;
  case DirectoryContents:
    local_c = llb_build_key_kind_directory_contents;
    break;
  case FilteredDirectoryContents:
    local_c = llb_build_key_kind_filtered_directory_contents;
    break;
  case DirectoryTreeSignature:
    local_c = llb_build_key_kind_directory_tree_signature;
    break;
  case DirectoryTreeStructureSignature:
    local_c = llb_build_key_kind_directory_tree_structure_signature;
    break;
  case Node:
    local_c = llb_build_key_kind_node;
    break;
  case Stat:
    local_c = llb_build_key_kind_stat;
    break;
  case Target:
    local_c = llb_build_key_kind_target;
    break;
  case Unknown:
    local_c = llb_build_key_kind_unknown;
    break;
  default:
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  return local_c;
}

Assistant:

static inline llb_build_key_kind_t internalToPublicBuildKeyKind(const BuildKey::Kind kind) {
  switch (kind) {
    case BuildKey::Kind::Command:
      return llb_build_key_kind_command;
    case BuildKey::Kind::CustomTask:
      return llb_build_key_kind_custom_task;
    case BuildKey::Kind::DirectoryContents:
      return llb_build_key_kind_directory_contents;
    case BuildKey::Kind::FilteredDirectoryContents:
      return llb_build_key_kind_filtered_directory_contents;
    case BuildKey::Kind::DirectoryTreeSignature:
      return llb_build_key_kind_directory_tree_signature;
    case BuildKey::Kind::DirectoryTreeStructureSignature:
      return llb_build_key_kind_directory_tree_structure_signature;
    case BuildKey::Kind::Node:
      return llb_build_key_kind_node;
    case BuildKey::Kind::Stat:
      return llb_build_key_kind_stat;
    case BuildKey::Kind::Target:
      return llb_build_key_kind_target;
    case BuildKey::Kind::Unknown:
      return llb_build_key_kind_unknown;
  }
}